

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O1

void __thiscall cp::CoMTrack::calcCoMTrack(CoMTrack *this,Vector2 *ref_cp)

{
  double dVar1;
  Vector2 now_com_pos;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48;
  Matrix<double,_2,_1,_0,_2,_1> local_28;
  
  local_48.m_xpr = &local_28;
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       *(double *)(this + 0x48);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_48,(Scalar *)(this + 0x50));
  if ((local_48.m_currentBlockRows + local_48.m_row == 2) && (local_48.m_col == 1)) {
    dVar1 = (ref_cp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
    *(double *)(this + 0x48) =
         *(double *)(this + 0x38) *
         ((ref_cp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[0] -
         local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
         array[0]) * *(double *)(this + 0x40) +
         local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
         array[0];
    *(double *)(this + 0x50) =
         *(double *)(this + 0x38) *
         (dVar1 - local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array[1]) * *(double *)(this + 0x40) +
         local_28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
         array[1];
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
               );
}

Assistant:

void CoMTrack::calcCoMTrack(const Vector2& ref_cp) {
  Vector2 now_com_pos, com_vel, com_pos;
  now_com_pos << ref_com[0], ref_com[1];
  com_vel = w_s * (ref_cp - now_com_pos);
  com_pos = now_com_pos + com_vel * dt_s;
  ref_com[0] = com_pos[0];
  ref_com[1] = com_pos[1];
}